

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall
QtPrivate::QCalendarModel::setHorizontalHeaderFormat
          (QCalendarModel *this,HorizontalHeaderFormat format)

{
  int iVar1;
  long lVar2;
  int in_ESI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  int oldFormat;
  undefined1 local_38 [24];
  undefined1 local_20 [8];
  QCalendarModel *in_stack_ffffffffffffffe8;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(in_RDI + 0x44) != in_ESI) {
    iVar1 = *(int *)(in_RDI + 0x44);
    *(int *)(in_RDI + 0x44) = in_ESI;
    if (iVar1 == 0) {
      QModelIndex::QModelIndex((QModelIndex *)0x519d7b);
      QAbstractItemModel::beginInsertRows(in_RDI,(int)local_20,0);
      *(undefined4 *)(in_RDI + 0x14) = 1;
      QAbstractItemModel::endInsertRows();
    }
    else if (*(int *)(in_RDI + 0x44) == 0) {
      QModelIndex::QModelIndex((QModelIndex *)0x519db6);
      QAbstractItemModel::beginRemoveRows(in_RDI,(int)local_38,0);
      *(undefined4 *)(in_RDI + 0x14) = 0;
      QAbstractItemModel::endRemoveRows();
    }
    internalUpdate(in_stack_ffffffffffffffe8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCalendarModel::setHorizontalHeaderFormat(QCalendarWidget::HorizontalHeaderFormat format)
{
    if (m_horizontalHeaderFormat == format)
        return;

    int oldFormat = m_horizontalHeaderFormat;
    m_horizontalHeaderFormat = format;
    if (oldFormat == QCalendarWidget::NoHorizontalHeader) {
        beginInsertRows(QModelIndex(), 0, 0);
        m_firstRow = 1;
        endInsertRows();
    } else if (m_horizontalHeaderFormat == QCalendarWidget::NoHorizontalHeader) {
        beginRemoveRows(QModelIndex(), 0, 0);
        m_firstRow = 0;
        endRemoveRows();
    }
    internalUpdate();
}